

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixGetTempname(int nBuf,char *zBuf)

{
  int iVar1;
  undefined8 local_30;
  u64 r;
  char *pcStack_20;
  int iLimit;
  char *zDir;
  char *zBuf_local;
  int nBuf_local;
  
  r._4_4_ = 0;
  *zBuf = '\0';
  zDir = zBuf;
  zBuf_local._0_4_ = nBuf;
  pcStack_20 = unixTempFileDir();
  if (pcStack_20 == (char *)0x0) {
    zBuf_local._4_4_ = 0x190a;
  }
  else {
    do {
      sqlite3_randomness(8,&local_30);
      zDir[(int)zBuf_local + -2] = '\0';
      sqlite3_snprintf((int)zBuf_local,zDir,"%s/etilqs_%llx%c",pcStack_20,local_30,0);
      if ((zDir[(int)zBuf_local + -2] != '\0') || (10 < r._4_4_)) {
        return 1;
      }
      r._4_4_ = r._4_4_ + 1;
      iVar1 = (*aSyscall[2].pCurrent)(zDir,0);
    } while (iVar1 == 0);
    zBuf_local._4_4_ = 0;
  }
  return zBuf_local._4_4_;
}

Assistant:

static int unixGetTempname(int nBuf, char *zBuf){
  const char *zDir;
  int iLimit = 0;

  /* It's odd to simulate an io-error here, but really this is just
  ** using the io-error infrastructure to test that SQLite handles this
  ** function failing. 
  */
  zBuf[0] = 0;
  SimulateIOError( return SQLITE_IOERR );

  zDir = unixTempFileDir();
  if( zDir==0 ) return SQLITE_IOERR_GETTEMPPATH;
  do{
    u64 r;
    sqlite3_randomness(sizeof(r), &r);
    assert( nBuf>2 );
    zBuf[nBuf-2] = 0;
    sqlite3_snprintf(nBuf, zBuf, "%s/"SQLITE_TEMP_FILE_PREFIX"%llx%c",
                     zDir, r, 0);
    if( zBuf[nBuf-2]!=0 || (iLimit++)>10 ) return SQLITE_ERROR;
  }while( osAccess(zBuf,0)==0 );
  return SQLITE_OK;
}